

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRightNoNZ
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *param_2)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  cpp_dec_float<50U,_int,_void> *v;
  int *piVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_c8;
  cpp_dec_float<50U,_int,_void> local_88;
  int *local_50;
  pointer local_48;
  int *local_40;
  int *local_38;
  
  iVar2 = (this->l).firstUnused;
  iVar4 = (this->l).firstUpdate;
  lVar5 = (long)iVar4;
  if (iVar4 < iVar2) {
    local_48 = (this->l).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_50 = (this->l).idx;
    local_38 = (this->l).row;
    local_40 = (this->l).start;
    do {
      iVar4 = local_38[lVar5];
      local_88.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 8);
      local_88.data._M_elems._0_8_ = *(undefined8 *)vec[iVar4].m_backend.data._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar4].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar4].m_backend.data._M_elems + 4;
      local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.exp = vec[iVar4].m_backend.exp;
      local_88.neg = vec[iVar4].m_backend.neg;
      local_88.fpclass = vec[iVar4].m_backend.fpclass;
      local_88.prec_elem = vec[iVar4].m_backend.prec_elem;
      if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_00289dbd:
        iVar4 = local_40[lVar5];
        iVar6 = local_40[lVar5 + 1];
        if (iVar4 < iVar6) {
          pcVar8 = &local_48[iVar4].m_backend;
          piVar7 = local_50 + iVar4;
          do {
            local_c8.fpclass = cpp_dec_float_finite;
            local_c8.prec_elem = 10;
            local_c8.data._M_elems[0] = 0;
            local_c8.data._M_elems[1] = 0;
            local_c8.data._M_elems[2] = 0;
            local_c8.data._M_elems[3] = 0;
            local_c8.data._M_elems[4] = 0;
            local_c8.data._M_elems[5] = 0;
            local_c8.data._M_elems._24_5_ = 0;
            local_c8.data._M_elems[7]._1_3_ = 0;
            local_c8.data._M_elems._32_5_ = 0;
            local_c8.data._M_elems[9]._1_3_ = 0;
            local_c8.exp = 0;
            local_c8.neg = false;
            v = &local_88;
            if (pcVar8 != &local_c8) {
              local_c8.data._M_elems._32_5_ = local_88.data._M_elems._32_5_;
              local_c8.data._M_elems[9]._1_3_ = local_88.data._M_elems[9]._1_3_;
              local_c8.data._M_elems[4] = local_88.data._M_elems[4];
              local_c8.data._M_elems[5] = local_88.data._M_elems[5];
              local_c8.data._M_elems._24_5_ = local_88.data._M_elems._24_5_;
              local_c8.data._M_elems[7]._1_3_ = local_88.data._M_elems[7]._1_3_;
              local_c8.data._M_elems[0] = local_88.data._M_elems[0];
              local_c8.data._M_elems[1] = local_88.data._M_elems[1];
              local_c8.data._M_elems[2] = local_88.data._M_elems[2];
              local_c8.data._M_elems[3] = local_88.data._M_elems[3];
              local_c8.exp = local_88.exp;
              local_c8.neg = local_88.neg;
              local_c8.fpclass = local_88.fpclass;
              local_c8.prec_elem = local_88.prec_elem;
              v = pcVar8;
            }
            pcVar8 = pcVar8 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_c8,v);
            iVar3 = *piVar7;
            piVar7 = piVar7 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&vec[iVar3].m_backend,&local_c8);
            iVar6 = iVar6 + -1;
          } while (iVar4 < iVar6);
        }
      }
      else {
        local_c8.fpclass = cpp_dec_float_finite;
        local_c8.prec_elem = 10;
        local_c8.data._M_elems[0] = 0;
        local_c8.data._M_elems[1] = 0;
        local_c8.data._M_elems[2] = 0;
        local_c8.data._M_elems[3] = 0;
        local_c8.data._M_elems[4] = 0;
        local_c8.data._M_elems[5] = 0;
        local_c8.data._M_elems._24_5_ = 0;
        local_c8.data._M_elems[7]._1_3_ = 0;
        local_c8.data._M_elems._32_5_ = 0;
        local_c8.data._M_elems[9]._1_3_ = 0;
        local_c8.exp = 0;
        local_c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_c8,0.0);
        iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_88,&local_c8);
        if (iVar4 != 0) goto LAB_00289dbd;
      }
      lVar5 = lVar5 + 1;
    } while (iVar2 != (int)lVar5);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUpdateRightNoNZ(R* vec, R /*eps*/)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            vec[*idx++] -= x * (*val++);
         }
      }
   }
}